

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

void __thiscall tinyexr::HeaderInfo::clear(HeaderInfo *this)

{
  HeaderInfo *this_local;
  
  std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::clear(&this->channels)
  ;
  std::vector<TEXRAttribute,_std::allocator<TEXRAttribute>_>::clear(&this->attributes);
  (this->data_window).min_x = 0;
  (this->data_window).min_y = 0;
  (this->data_window).max_x = 0;
  (this->data_window).max_y = 0;
  this->line_order = 0;
  (this->display_window).min_x = 0;
  (this->display_window).min_y = 0;
  (this->display_window).max_x = 0;
  (this->display_window).max_y = 0;
  this->screen_window_center[0] = 0.0;
  this->screen_window_center[1] = 0.0;
  this->screen_window_width = 0.0;
  this->pixel_aspect_ratio = 0.0;
  this->chunk_count = 0;
  this->tiled = 0;
  this->tile_size_x = 0;
  this->tile_size_y = 0;
  this->tile_level_mode = 0;
  this->tile_rounding_mode = 0;
  this->header_len = 0;
  this->compression_type = 0;
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  return;
}

Assistant:

void clear() {
    channels.clear();
    attributes.clear();

    data_window.min_x = 0;
    data_window.min_y = 0;
    data_window.max_x = 0;
    data_window.max_y = 0;
    line_order = 0;
    display_window.min_x = 0;
    display_window.min_y = 0;
    display_window.max_x = 0;
    display_window.max_y = 0;
    screen_window_center[0] = 0.0f;
    screen_window_center[1] = 0.0f;
    screen_window_width = 0.0f;
    pixel_aspect_ratio = 0.0f;

    chunk_count = 0;

    // Tiled format
    tiled = 0;
    tile_size_x = 0;
    tile_size_y = 0;
    tile_level_mode = 0;
    tile_rounding_mode = 0;

    header_len = 0;
    compression_type = 0;

    name.clear();
    type.clear();
  }